

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O2

void subscript_suite::run(void)

{
  index_null();
  index_boolean();
  index_integer();
  index_real();
  index_string();
  index_array();
  index_array_const();
  index_map();
  key_const_null();
  key_null();
  key_boolean();
  key_integer();
  key_real();
  key_string();
  key_array();
  key_map();
  key_const_map();
  create_map_key();
  return;
}

Assistant:

void run()
{
    index_null();
    index_boolean();
    index_integer();
    index_real();
    index_string();
    index_array();
    index_array_const();
    index_map();

    key_const_null();
    key_null();
    key_boolean();
    key_integer();
    key_real();
    key_string();
    key_array();
    key_map();
    key_const_map();

    create_map_key();
}